

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitester.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  FILE *__stream;
  size_t sVar6;
  ssize_t sVar7;
  void *pvVar8;
  undefined8 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong __n;
  long *plVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  char buf [4096];
  string jdata;
  string filename;
  string basename;
  long *local_110;
  ulong local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  long *local_f0;
  size_t local_e8;
  long local_e0;
  undefined8 uStack_d8;
  string odata;
  string s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<UniValue,_std::allocator<UniValue>_> vStack_70;
  string prefix;
  
  buf[0x148] = '\0';
  buf[0x149] = '\0';
  buf[0x14a] = '\0';
  buf[0x14b] = '\0';
  buf[0x14c] = '\0';
  buf[0x14d] = '\0';
  buf[0x14e] = '\0';
  buf[0x14f] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = 0;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&basename,*(char **)((long)filenames + lVar12),(allocator<char> *)buf);
    buf._0_8_ = buf + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)buf,srcdir_abi_cxx11_._M_dataplus._M_p,
               srcdir_abi_cxx11_._M_dataplus._M_p + srcdir_abi_cxx11_._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,"/");
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                       basename._M_dataplus._M_p,basename._M_string_length);
    filename._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar10 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p == paVar10) {
      filename.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      filename.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      filename._M_dataplus._M_p = (pointer)&filename.field_2;
    }
    else {
      filename.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    filename._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    if ((char *)buf._0_8_ != buf + 0x10) {
      operator_delete((void *)buf._0_8_,buf._16_8_ + 1);
    }
    __stream = fopen(filename._M_dataplus._M_p,"r");
    if (__stream == (FILE *)0x0) {
      __assert_fail("f != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                    ,0x34,"void runtest_file(const char *)");
    }
    jdata._M_dataplus._M_p = (pointer)&jdata.field_2;
    jdata._M_string_length = 0;
    jdata.field_2._M_local_buf[0] = '\0';
    while (iVar3 = feof(__stream), iVar3 == 0) {
      sVar6 = fread((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,1,
                    0x1000,__stream);
      iVar3 = ferror(__stream);
      if (iVar3 != 0) {
        __assert_fail("!ferror(f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                      ,0x3b,"void runtest_file(const char *)");
      }
      s._M_dataplus._M_p = (pointer)&s.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&s,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buf,
                 buf + (int)sVar6);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&jdata,s._M_dataplus._M_p,s._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)s._M_dataplus._M_p != &s.field_2) {
        operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
      }
    }
    iVar3 = ferror(__stream);
    if (iVar3 != 0) {
      __assert_fail("!ferror(f)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                    ,0x41,"void runtest_file(const char *)");
    }
    fclose(__stream);
    local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1198,basename._M_dataplus._M_p,
               basename._M_dataplus._M_p + basename._M_string_length);
    sVar6 = 4;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&prefix,&local_1198,0,4);
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&prefix,"pass");
    if (iVar3 == 0) {
      bVar13 = true;
    }
    else {
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&prefix,"roun");
      bVar13 = iVar3 == 0;
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&prefix,"fail");
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&prefix,"roun");
    if ((!bVar13) && (iVar3 != 0)) {
      __assert_fail("wantPass || wantFail",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                    ,0x1e,"void runtest(std::string, const std::string &)");
    }
    s._M_string_length = (long)&s.field_2 + 8;
    s.field_2._M_allocated_capacity = 0;
    s.field_2._M_local_buf[8] = '\0';
    s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
    vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_70.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar7 = UniValue::read((UniValue *)&s,(int)jdata._M_string_length,jdata._M_dataplus._M_p,sVar6);
    if (bVar13) {
      if ((char)sVar7 == '\0') {
        __assert_fail("testResult == true",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                      ,0x24,"void runtest(std::string, const std::string &)");
      }
    }
    else if ((char)sVar7 != '\0') {
      __assert_fail("testResult == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                    ,0x26,"void runtest(std::string, const std::string &)");
    }
    if (iVar4 == 0) {
      UniValue::write_abi_cxx11_((UniValue *)&odata,(int)&s,(void *)0x0,0);
      local_110 = (long *)&local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,jdata._M_dataplus._M_p,
                 jdata._M_dataplus._M_p + jdata._M_string_length);
      uVar2 = local_108;
      plVar11 = local_110;
      for (__n = local_108; __n != 0; __n = __n - 1) {
        pvVar8 = memchr(" \n\r\t",(int)*(char *)((long)plVar11 + (__n - 1)),4);
        if (pvVar8 == (void *)0x0) {
          if (__n <= uVar2) goto LAB_0010431a;
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            uVar9 = std::__throw_out_of_range_fmt
                              ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                               "basic_string::erase",__n,uVar2);
            if (local_110 != (long *)&local_100) {
              operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)odata._M_dataplus._M_p != &odata.field_2) {
              operator_delete(odata._M_dataplus._M_p,odata.field_2._M_allocated_capacity + 1);
            }
            UniValue::~UniValue((UniValue *)&s);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prefix._M_dataplus._M_p != &prefix.field_2) {
              operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
              operator_delete(local_1198._M_dataplus._M_p,
                              local_1198.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)jdata._M_dataplus._M_p != &jdata.field_2) {
              operator_delete(jdata._M_dataplus._M_p,
                              CONCAT71(jdata.field_2._M_allocated_capacity._1_7_,
                                       jdata.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)filename._M_dataplus._M_p != &filename.field_2) {
              operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)basename._M_dataplus._M_p != &basename.field_2) {
              operator_delete(basename._M_dataplus._M_p,basename.field_2._M_allocated_capacity + 1);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              _Unwind_Resume(uVar9);
            }
          }
          goto LAB_0010481f;
        }
      }
      __n = 0;
LAB_0010431a:
      *(undefined1 *)((long)plVar11 + __n) = 0;
      plVar11 = local_110;
      if (local_110 == (long *)&local_100) {
        uStack_d8 = uStack_f8;
        plVar11 = &local_e0;
      }
      local_e0 = CONCAT71(uStack_ff,local_100);
      local_108 = 0;
      local_100 = 0;
      local_110 = (long *)&local_100;
      local_f0 = plVar11;
      local_e8 = __n;
      if ((odata._M_string_length != __n) ||
         ((__n != 0 && (iVar3 = bcmp(odata._M_dataplus._M_p,plVar11,__n), iVar3 != 0)))) {
        __assert_fail("odata == rtrim(jdata)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                      ,0x2b,"void runtest(std::string, const std::string &)");
      }
      if ((plVar11 != &local_e0) &&
         (operator_delete(plVar11,local_e0 + 1), local_110 != (long *)&local_100)) {
        operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)odata._M_dataplus._M_p != &odata.field_2) {
        operator_delete(odata._M_dataplus._M_p,odata.field_2._M_allocated_capacity + 1);
      }
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&vStack_70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    if ((undefined1 *)s._M_string_length != (undefined1 *)((long)&s.field_2 + 8)) {
      operator_delete((void *)s._M_string_length,
                      CONCAT71(s.field_2._9_7_,s.field_2._M_local_buf[8]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
      operator_delete(local_1198._M_dataplus._M_p,local_1198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)jdata._M_dataplus._M_p != &jdata.field_2) {
      operator_delete(jdata._M_dataplus._M_p,
                      CONCAT71(jdata.field_2._M_allocated_capacity._1_7_,
                               jdata.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename._M_dataplus._M_p != &filename.field_2) {
      operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)basename._M_dataplus._M_p != &basename.field_2) {
      operator_delete(basename._M_dataplus._M_p,basename.field_2._M_allocated_capacity + 1);
    }
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0x1b0);
  unescape_unicode_test();
  no_nul_test();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return 0;
  }
LAB_0010481f:
  __stack_chk_fail();
}

Assistant:

int main (int argc, char *argv[])
{
    for (const auto& f: filenames) {
        runtest_file(f);
    }

    unescape_unicode_test();
    no_nul_test();

    return 0;
}